

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

void Cba_ManExtractGroupInt
               (Cba_Ntk_t *pNew,Cba_Ntk_t *p,Vec_Int_t *vObjs,Vec_Int_t *vFonIns,Vec_Int_t *vFonOuts
               )

{
  int iVar1;
  int x;
  int iVar2;
  int iVar3;
  int local_48;
  int local_44;
  int iFon;
  int iFin;
  int iObjNew;
  int iObj;
  int k;
  int i;
  Vec_Int_t *vFonOuts_local;
  Vec_Int_t *vFonIns_local;
  Vec_Int_t *vObjs_local;
  Cba_Ntk_t *p_local;
  Cba_Ntk_t *pNew_local;
  
  Cba_NtkCleanObjCopies(p);
  Cba_NtkCleanFonCopies(p);
  for (iObj = 0; iVar1 = Vec_IntSize(vFonIns), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(vFonIns,iObj);
    iVar3 = Cba_ObjAlloc(pNew,CBA_OBJ_PI,0,1);
    iVar2 = Cba_ObjFon0(pNew,iVar3);
    Cba_FonSetCopy(p,iVar1,iVar2);
    iVar2 = Cba_NtkHasObjNames(p);
    if (iVar2 != 0) {
      iVar2 = Cba_FonObj(p,iVar1);
      iVar2 = Cba_ObjName(p,iVar2);
      Cba_ObjSetName(pNew,iVar3,iVar2);
    }
    iVar2 = Cba_NtkHasFonNames(p);
    if (iVar2 != 0) {
      iVar3 = Cba_ObjFon0(pNew,iVar3);
      iVar1 = Cba_FonName(p,iVar1);
      Cba_FonSetName(pNew,iVar3,iVar1);
    }
  }
  for (iObj = 0; iVar1 = Vec_IntSize(vObjs), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(vObjs,iObj);
    iVar3 = Cba_ObjDup(pNew,p,iVar1);
    iVar2 = Cba_NtkHasObjNames(p);
    if (iVar2 != 0) {
      iVar2 = Cba_ObjName(p,iVar1);
      Cba_ObjSetName(pNew,iVar3,iVar2);
    }
    iObjNew = 0;
    for (local_48 = Cba_ObjFon0(p,iVar1); iVar2 = Cba_ObjFon0(p,iVar1 + 1), local_48 < iVar2;
        local_48 = local_48 + 1) {
      iVar2 = Cba_ObjFon(pNew,iVar3,iObjNew);
      Cba_FonSetCopy(p,local_48,iVar2);
      iVar2 = Cba_NtkHasFonNames(p);
      if (iVar2 != 0) {
        iVar2 = Cba_ObjFon(pNew,iVar3,iObjNew);
        x = Cba_FonName(p,local_48);
        Cba_FonSetName(pNew,iVar2,x);
      }
      iObjNew = iObjNew + 1;
    }
  }
  for (iObj = 0; iVar1 = Vec_IntSize(vObjs), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(vObjs,iObj);
    iVar3 = Cba_ObjCopy(p,iVar1);
    iObjNew = 0;
    for (local_44 = Cba_ObjFin0(p,iVar1); iVar2 = Cba_ObjFin0(p,iVar1 + 1), local_44 < iVar2;
        local_44 = local_44 + 1) {
      iVar2 = Cba_FinFon(p,local_44);
      iVar2 = Cba_FonCopy(p,iVar2);
      Cba_ObjSetFinFon(pNew,iVar3,iObjNew,iVar2);
      iObjNew = iObjNew + 1;
    }
  }
  for (iObj = 0; iVar1 = Vec_IntSize(vFonOuts), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(vFonOuts,iObj);
    iVar3 = Cba_ObjAlloc(pNew,CBA_OBJ_PO,1,0);
    iVar2 = Cba_NtkHasObjNames(p);
    if (iVar2 != 0) {
      iVar2 = Cba_FonName(p,iVar1);
      Cba_ObjSetName(pNew,iVar3,iVar2);
    }
    iVar1 = Cba_FonCopy(p,iVar1);
    Cba_ObjSetFinFon(pNew,iVar3,0,iVar1);
  }
  iVar1 = Cba_NtkObjNum(pNew);
  iVar3 = Cba_NtkObjNumAlloc(pNew);
  if (iVar1 != iVar3) {
    __assert_fail("Cba_NtkObjNum(pNew) == Cba_NtkObjNumAlloc(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaNtk.c"
                  ,0x3bb,
                  "void Cba_ManExtractGroupInt(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  iVar1 = Cba_NtkFinNum(pNew);
  iVar3 = Cba_NtkFinNumAlloc(pNew);
  if (iVar1 != iVar3) {
    __assert_fail("Cba_NtkFinNum(pNew) == Cba_NtkFinNumAlloc(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaNtk.c"
                  ,0x3bc,
                  "void Cba_ManExtractGroupInt(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  iVar1 = Cba_NtkFonNum(pNew);
  iVar3 = Cba_NtkFonNumAlloc(pNew);
  if (iVar1 != iVar3) {
    __assert_fail("Cba_NtkFonNum(pNew) == Cba_NtkFonNumAlloc(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaNtk.c"
                  ,0x3bd,
                  "void Cba_ManExtractGroupInt(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  return;
}

Assistant:

void Cba_ManExtractGroupInt( Cba_Ntk_t * pNew, Cba_Ntk_t * p, Vec_Int_t * vObjs, Vec_Int_t * vFonIns, Vec_Int_t * vFonOuts )
{
    int i, k, iObj, iObjNew, iFin, iFon;
    Cba_NtkCleanObjCopies( p );
    Cba_NtkCleanFonCopies( p );
    // create inputs and map fons
    Vec_IntForEachEntry( vFonIns, iFon, i )
    {
        iObjNew = Cba_ObjAlloc( pNew, CBA_OBJ_PI, 0, 1 );
        Cba_FonSetCopy( p, iFon, Cba_ObjFon0(pNew, iObjNew) );
        if ( Cba_NtkHasObjNames(p) )
            Cba_ObjSetName( pNew, iObjNew, Cba_ObjName(p, Cba_FonObj(p, iFon)) );
        if ( Cba_NtkHasFonNames(p) )
            Cba_FonSetName( pNew, Cba_ObjFon0(pNew, iObjNew), Cba_FonName(p, iFon) );

    }
    // create internal
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        iObjNew = Cba_ObjDup( pNew, p, iObj );
        if ( Cba_NtkHasObjNames(p) )
            Cba_ObjSetName( pNew, iObjNew, Cba_ObjName(p, iObj) );
        Cba_ObjForEachFon( p, iObj, iFon, k )
        {
            Cba_FonSetCopy( p, iFon, Cba_ObjFon(pNew, iObjNew, k) );
            if ( Cba_NtkHasFonNames(p) )
                Cba_FonSetName( pNew, Cba_ObjFon(pNew, iObjNew, k), Cba_FonName(p, iFon) );
        }
    }
    // connect internal
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        iObjNew = Cba_ObjCopy( p, iObj );
        Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
            Cba_ObjSetFinFon( pNew, iObjNew, k, Cba_FonCopy(p, iFon) );
    }
    // create POs
    Vec_IntForEachEntry( vFonOuts, iFon, i )
    {
        iObjNew = Cba_ObjAlloc( pNew, CBA_OBJ_PO, 1, 0 );
        if ( Cba_NtkHasObjNames(p) )
            Cba_ObjSetName( pNew, iObjNew, Cba_FonName(p, iFon) );
        Cba_ObjSetFinFon( pNew, iObjNew, 0, Cba_FonCopy(p, iFon) );
    }
    assert( Cba_NtkObjNum(pNew) == Cba_NtkObjNumAlloc(pNew) );
    assert( Cba_NtkFinNum(pNew) == Cba_NtkFinNumAlloc(pNew) );
    assert( Cba_NtkFonNum(pNew) == Cba_NtkFonNumAlloc(pNew) );
}